

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall
flatbuffers::(anonymous_namespace)::
SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
          (_anonymous_namespace_ *this,uchar *begin,uchar *end,size_t width,
          anon_class_16_2_e19d79f7 comparator,anon_class_8_1_6663148b swapper)

{
  bool bVar1;
  anon_class_16_2_e19d79f7 comparator_00;
  anon_class_16_2_e19d79f7 comparator_01;
  anon_class_8_1_6663148b in_stack_ffffffffffffff88;
  _anonymous_namespace_ *local_48;
  uchar *r;
  uchar *l;
  size_t width_local;
  uchar *end_local;
  uchar *begin_local;
  anon_class_8_1_6663148b swapper_local;
  anon_class_16_2_e19d79f7 comparator_local;
  
  begin_local = (uchar *)comparator.key;
  comparator_00._0_8_ = comparator._0_8_;
  swapper_local.struct_size._0_2_ = (ushort)width;
  if ((long)end < (long)begin - (long)this) {
    r = (uchar *)(this + (long)end);
    local_48 = (_anonymous_namespace_ *)begin;
    while (r < local_48) {
      bVar1 = Parser::ParseVector::anon_class_16_2_e19d79f7::operator()
                        ((anon_class_16_2_e19d79f7 *)&swapper_local,(uint8_t *)this,r);
      if (bVar1) {
        local_48 = local_48 + -(long)end;
        Parser::ParseVector::anon_class_8_1_6663148b::operator()
                  ((anon_class_8_1_6663148b *)&begin_local,r,(uint8_t *)local_48);
      }
      else {
        r = end + (long)r;
      }
    }
    Parser::ParseVector::anon_class_8_1_6663148b::operator()
              ((anon_class_8_1_6663148b *)&begin_local,(uint8_t *)this,r + -(long)end);
    comparator_00.key = (FieldDef *)begin_local;
    SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
              (this,r + -(long)end,end,(ulong)(ushort)swapper_local.struct_size,comparator_00,
               in_stack_ffffffffffffff88);
    comparator_01.key = (FieldDef *)begin_local;
    comparator_01._0_8_ = comparator_00._0_8_;
    SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
              (local_48,begin,end,(ulong)(ushort)swapper_local.struct_size,comparator_01,
               (anon_class_8_1_6663148b)begin_local);
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}